

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O1

int __thiscall Imf_3_4::RgbaOutputFile::currentScanLine(RgbaOutputFile *this)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  
  __mutex = (pthread_mutex_t *)this->_toYca;
  if (__mutex == (pthread_mutex_t *)0x0) {
    iVar1 = OutputFile::currentScanLine(this->_outputFile);
    return iVar1;
  }
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    iVar1 = this->_toYca->_currentScanLine;
    pthread_mutex_unlock(__mutex);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

int
RgbaOutputFile::currentScanLine () const
{
    if (_toYca)
    {
        std::lock_guard<std::mutex> lock (*_toYca);
        return _toYca->currentScanLine ();
    }
    else { return _outputFile->currentScanLine (); }
}